

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  time_t tVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  uchar uVar8;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar7 = 1;
    bVar6 = greatest_info.flags;
    uVar8 = greatest_info.verbosity;
    do {
      pcVar5 = argv[iVar7];
      if (*pcVar5 != '-') goto LAB_0010369e;
      iVar4 = (byte)pcVar5[1] - 0x65;
      switch(iVar4) {
      case 0:
switchD_001035ff_caseD_0:
        greatest_info.exact_name_match = '\x01';
        break;
      case 1:
switchD_001035ff_caseD_1:
        bVar6 = bVar6 | 1;
        greatest_info.flags = bVar6;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x10:
      case 0x12:
switchD_001035ff_caseD_2:
        iVar4 = strncmp("--help",pcVar5,6);
        if (iVar4 == 0) {
          pcVar5 = *argv;
LAB_00103791:
          greatest_usage(pcVar5);
          exit(0);
        }
        iVar4 = strcmp("--",pcVar5);
        if (iVar4 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",pcVar5);
          pcVar5 = *argv;
LAB_00103775:
          greatest_usage(pcVar5);
          exit(1);
        }
        bVar2 = false;
        goto LAB_0010369a;
      case 3:
switchD_001035ff_caseD_3:
        pcVar5 = *argv;
        goto LAB_00103791;
      case 7:
switchD_001035ff_caseD_7:
        bVar6 = bVar6 | 2;
        greatest_info.flags = bVar6;
        break;
      case 0xe:
      case 0xf:
      case 0x13:
        iVar1 = iVar7 + 1;
        if (argc <= iVar1) {
          pcVar5 = *argv;
          goto LAB_00103775;
        }
        switch(iVar4) {
        case 0:
          goto switchD_001035ff_caseD_0;
        case 1:
          goto switchD_001035ff_caseD_1;
        case 2:
        case 4:
        case 5:
        case 6:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0x10:
        case 0x12:
          goto switchD_001035ff_caseD_2;
        case 3:
          goto switchD_001035ff_caseD_3;
        case 7:
          goto switchD_001035ff_caseD_7;
        case 0xe:
          greatest_info.suite_filter = argv[iVar1];
          break;
        case 0xf:
          greatest_info.test_filter = argv[iVar1];
          break;
        case 0x11:
          goto switchD_001035ff_caseD_11;
        case 0x13:
          greatest_info.test_exclude = argv[iVar1];
          break;
        default:
          goto switchD_001035ff_default;
        }
        bVar2 = true;
        iVar7 = iVar1;
        goto LAB_0010369a;
      case 0x11:
switchD_001035ff_caseD_11:
        uVar8 = uVar8 + '\x01';
        greatest_info.verbosity = uVar8;
        break;
      default:
switchD_001035ff_default:
        if (pcVar5[1] != 0x61) goto switchD_001035ff_caseD_2;
        bVar6 = bVar6 | 4;
        greatest_info.flags = bVar6;
      }
      bVar2 = true;
LAB_0010369a:
      if (!bVar2) break;
LAB_0010369e:
      iVar7 = iVar7 + 1;
    } while (iVar7 < argc);
  }
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  tinf_init();
  greatest_run_suite(tinflate,"tinflate");
  greatest_run_suite(tinfzlib,"tinfzlib");
  greatest_run_suite(tinfgzip,"tinfgzip");
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}